

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  int iVar1;
  long local_28;
  long supplied;
  XSizeHints *hints;
  int height_local;
  int width_local;
  _GLFWwindow *window_local;
  
  hints._0_4_ = height;
  hints._4_4_ = width;
  _height_local = window;
  supplied = (long)(*_glfw.x11.xlib.AllocSizeHints)();
  (*_glfw.x11.xlib.GetWMNormalHints)
            (_glfw.x11.display,(_height_local->x11).handle,(XSizeHints *)supplied,&local_28);
  *(ulong *)supplied = *(ulong *)supplied & 0xffffffffffffff4f;
  if (_height_local->monitor == (_GLFWmonitor *)0x0) {
    if (_height_local->resizable == 0) {
      *(ulong *)supplied = *(ulong *)supplied | 0x30;
      *(int *)(supplied + 0x20) = hints._4_4_;
      *(int *)(supplied + 0x18) = hints._4_4_;
      *(int *)(supplied + 0x24) = (int)hints;
      *(int *)(supplied + 0x1c) = (int)hints;
    }
    else {
      if ((_height_local->minwidth != -1) && (_height_local->minheight != -1)) {
        *(ulong *)supplied = *(ulong *)supplied | 0x10;
        *(int *)(supplied + 0x18) = _height_local->minwidth;
        *(int *)(supplied + 0x1c) = _height_local->minheight;
      }
      if ((_height_local->maxwidth != -1) && (_height_local->maxheight != -1)) {
        *(ulong *)supplied = *(ulong *)supplied | 0x20;
        *(int *)(supplied + 0x20) = _height_local->maxwidth;
        *(int *)(supplied + 0x24) = _height_local->maxheight;
      }
      if ((_height_local->numer != -1) && (_height_local->denom != -1)) {
        *(ulong *)supplied = *(ulong *)supplied | 0x80;
        iVar1 = _height_local->numer;
        *(int *)(supplied + 0x38) = iVar1;
        *(int *)(supplied + 0x30) = iVar1;
        iVar1 = _height_local->denom;
        *(int *)(supplied + 0x3c) = iVar1;
        *(int *)(supplied + 0x34) = iVar1;
      }
    }
  }
  (*_glfw.x11.xlib.SetWMNormalHints)
            (_glfw.x11.display,(_height_local->x11).handle,(XSizeHints *)supplied);
  (*_glfw.x11.xlib.Free)((void *)supplied);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    long supplied;
    XGetWMNormalHints(_glfw.x11.display, window->x11.handle, hints, &supplied);

    hints->flags &= ~(PMinSize | PMaxSize | PAspect);

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}